

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void juzzlin::SimpleLogger::setLevelSymbol(Level level,string *symbol)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)symbol);
  Impl::setLevelSymbol(level,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SimpleLogger::setLevelSymbol(Level level, std::string symbol)
{
    Impl::setLevelSymbol(level, symbol);
}